

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesGenericDiagonalMass.cpp
# Opt level: O1

void __thiscall
chrono::ChVariablesGenericDiagonalMass::Compute_inc_invMb_v
          (ChVariablesGenericDiagonalMass *this,ChVectorRef *result,ChVectorConstRef vect)

{
  ulong uVar1;
  ulong uVar2;
  PointerType pdVar3;
  double *pdVar4;
  Index size;
  ulong uVar5;
  Index index;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [64];
  
  uVar1 = *(ulong *)&(result->
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ).field_0x8;
  if (uVar1 != (long)this->ndof) {
    __assert_fail("result.size() == ndof",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesGenericDiagonalMass.cpp"
                  ,0x2f,
                  "virtual void chrono::ChVariablesGenericDiagonalMass::Compute_inc_invMb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  uVar2 = (vect->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
          .m_rows.m_value;
  if (uVar2 != (long)this->ndof) {
    __assert_fail("vect.size() == ndof",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChVariablesGenericDiagonalMass.cpp"
                  ,0x30,
                  "virtual void chrono::ChVariablesGenericDiagonalMass::Compute_inc_invMb_v(ChVectorRef, ChVectorConstRef) const"
                 );
  }
  uVar6 = (this->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  if (uVar2 != uVar6) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<double>, Lhs = const Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (uVar1 == uVar6) {
    uVar2 = *(ulong *)&result->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ;
    uVar6 = uVar1;
    if (((uVar2 & 7) == 0) &&
       (uVar6 = (ulong)(-((uint)(uVar2 >> 3) & 0x1fffffff) & 7), (long)uVar1 <= (long)uVar6)) {
      uVar6 = uVar1;
    }
    pdVar3 = (vect->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
             .m_data;
    pdVar4 = (this->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar7 = uVar1 - uVar6;
    uVar5 = uVar7 + 7;
    if (-1 < (long)uVar7) {
      uVar5 = uVar7;
    }
    if (0 < (long)uVar6) {
      uVar8 = 0;
      do {
        *(double *)(uVar2 + uVar8 * 8) =
             pdVar3[uVar8] / pdVar4[uVar8] + *(double *)(uVar2 + uVar8 * 8);
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
    }
    uVar5 = (uVar5 & 0xfffffffffffffff8) + uVar6;
    if (7 < (long)uVar7) {
      do {
        auVar9 = vdivpd_avx512f(*(undefined1 (*) [64])(pdVar3 + uVar6),
                                *(undefined1 (*) [64])(pdVar4 + uVar6));
        auVar9 = vaddpd_avx512f(auVar9,*(undefined1 (*) [64])(uVar2 + uVar6 * 8));
        *(undefined1 (*) [64])(uVar2 + uVar6 * 8) = auVar9;
        uVar6 = uVar6 + 8;
      } while ((long)uVar6 < (long)uVar5);
    }
    if ((long)uVar5 < (long)uVar1) {
      do {
        *(double *)(uVar2 + uVar5 * 8) =
             pdVar3[uVar5] / pdVar4[uVar5] + *(double *)(uVar2 + uVar5 * 8);
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    return;
  }
  __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Functor = Eigen::internal::add_assign_op<double, double>]"
               );
}

Assistant:

void ChVariablesGenericDiagonalMass::Compute_inc_invMb_v(ChVectorRef result, ChVectorConstRef vect) const {
    assert(result.size() == ndof);
    assert(vect.size() == ndof);
    result += vect.cwiseQuotient(MmassDiag);
}